

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O3

double __thiscall NJamSpell::TLangModel::Score(TLangModel *this,TWords *words)

{
  TWordId *__args;
  pointer pTVar1;
  TWord *w;
  pointer word;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double __x;
  TWordId local_54;
  double local_50;
  undefined1 auStack_48 [8];
  TWordIds sentence;
  
  auStack_48 = (undefined1  [8])0x0;
  sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  word = (words->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pTVar1 = (words->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (word == pTVar1) {
    local_50 = 2.2250738585072014e-308;
  }
  else {
    do {
      local_54 = GetWordIdNoCreate(this,word);
      if (sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_48,
                   (iterator)
                   sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_54);
      }
      else {
        *sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start = local_54;
        sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      word = word + 1;
    } while (word != pTVar1);
    if (auStack_48 ==
        (undefined1  [8])
        sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_50 = 2.2250738585072014e-308;
    }
    else {
      __args = &this->UnknownWordId;
      if (sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_48,
                   (iterator)
                   sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,__args);
      }
      else {
        *sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start = *__args;
        sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      if (sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_48,
                   (iterator)
                   sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,__args);
      }
      else {
        *sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start = *__args;
        sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      local_50 = 0.0;
      if ((long)sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start - (long)auStack_48 != 8) {
        uVar2 = 0;
        do {
          dVar3 = GetGram1Prob(this,*(TWordId *)((long)auStack_48 + uVar2 * 4));
          dVar3 = log(dVar3);
          dVar4 = GetGram2Prob(this,*(TWordId *)((long)auStack_48 + uVar2 * 4),
                               *(TWordId *)((long)auStack_48 + (uVar2 + 1) * 4));
          dVar4 = log(dVar4);
          __x = GetGram3Prob(this,*(TWordId *)((long)auStack_48 + uVar2 * 4),
                             *(TWordId *)((long)auStack_48 + (uVar2 + 1) * 4),
                             *(TWordId *)((long)auStack_48 + (uVar2 + 2) * 4));
          uVar2 = uVar2 + 1;
          local_50 = local_50 + dVar3 + dVar4;
          dVar3 = log(__x);
          local_50 = local_50 + dVar3;
        } while (uVar2 < ((long)sentence.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start - (long)auStack_48 >> 2) -
                         2U);
      }
    }
    if (auStack_48 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_48);
    }
  }
  return local_50;
}

Assistant:

double TLangModel::Score(const TWords& words) const {
    TWordIds sentence;
    for (auto&& w: words) {
        sentence.push_back(GetWordIdNoCreate(w));
    }
    if (sentence.empty()) {
        return std::numeric_limits<double>::min();
    }

    sentence.push_back(UnknownWordId);
    sentence.push_back(UnknownWordId);

    double result = 0;
    for (size_t i = 0; i < sentence.size() - 2; ++i) {
        result += log(GetGram1Prob(sentence[i]));
        result += log(GetGram2Prob(sentence[i], sentence[i + 1]));
        result += log(GetGram3Prob(sentence[i], sentence[i + 1], sentence[i + 2]));
    }
    return result;
}